

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O0

int oonf_stream_add(oonf_stream_socket *stream_socket,netaddr_socket *local)

{
  list_entity **pplVar1;
  oonf_log_source source;
  uint16_t uVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  list_entity *plVar7;
  os_fd *poVar8;
  undefined1 local_ee [8];
  netaddr_str buf;
  netaddr_socket *local_local;
  oonf_stream_socket *stream_socket_local;
  int result;
  
  buf.buf._54_8_ = local;
  uVar2 = netaddr_socket_get_port(local);
  if (uVar2 == 0) {
LAB_00125a9d:
    memcpy(&stream_socket->local_socket,(void *)buf.buf._54_8_,0x80);
    if ((stream_socket->config).memcookie == (oonf_class *)0x0) {
      (stream_socket->config).memcookie = &_connection_cookie;
    }
    if ((stream_socket->config).allowed_sessions == 0) {
      (stream_socket->config).allowed_sessions = 10;
    }
    if ((stream_socket->config).maximum_input_buffer == 0) {
      (stream_socket->config).maximum_input_buffer = 0x10000;
    }
    plVar7 = &stream_socket->session;
    (stream_socket->session).prev = plVar7;
    plVar7->next = plVar7;
    (stream_socket->_node).next = &_stream_head;
    (stream_socket->_node).prev = _stream_head.prev;
    pplVar1 = &(_stream_head.prev)->next;
    _stream_head.prev = &stream_socket->_node;
    *pplVar1 = &stream_socket->_node;
    stream_socket_local._0_4_ = 0;
  }
  else {
    iVar3 = os_fd_generic_getsocket
                      (&(stream_socket->scheduler_entry).fd,(netaddr_socket *)buf.buf._54_8_,true,0,
                       (os_interface *)0x0,_oonf_stream_socket_subsystem.logging);
    if (iVar3 == 0) {
      iVar3 = listen((stream_socket->scheduler_entry).fd.fd,1);
      source = _oonf_stream_socket_subsystem.logging;
      if (iVar3 != -1) {
        (stream_socket->scheduler_entry).name = stream_socket->socket_name;
        (stream_socket->scheduler_entry).process = _cb_parse_request;
        pcVar4 = netaddr_socket_to_string((netaddr_str *)local_ee,(netaddr_socket *)buf.buf._54_8_);
        snprintf(stream_socket->socket_name,0x4c,"tcp-server: %s",pcVar4);
        oonf_socket_add(&stream_socket->scheduler_entry);
        oonf_socket_set_read(&stream_socket->scheduler_entry,true);
        goto LAB_00125a9d;
      }
      if ((log_global_mask[_oonf_stream_socket_subsystem.logging] & 4) != 0) {
        pcVar4 = netaddr_socket_to_string((netaddr_str *)local_ee,(netaddr_socket *)buf.buf._54_8_);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        piVar5 = __errno_location();
        oonf_log(LOG_SEVERITY_WARN,source,"src/base/oonf_stream_socket.c",0xac,(void *)0x0,0,
                 "tcp socket listen failed for %s: %s (%d)\n",pcVar4,pcVar6,*piVar5);
      }
    }
    oonf_socket_remove(&stream_socket->scheduler_entry);
    poVar8 = &(stream_socket->scheduler_entry).fd;
    if (poVar8->fd != -1) {
      close(poVar8->fd);
      poVar8->fd = -1;
    }
    stream_socket_local._0_4_ = -1;
  }
  return (int)stream_socket_local;
}

Assistant:

int
oonf_stream_add(struct oonf_stream_socket *stream_socket, const union netaddr_socket *local) {
  struct netaddr_str buf;

  /* server socket not necessary for outgoing connections */
  if (netaddr_socket_get_port(local) != 0) {
    /* Init socket */
    if (os_fd_getsocket(&stream_socket->scheduler_entry.fd, local, true, 0, NULL, LOG_STREAM)) {
      goto add_stream_error;
    }

    /* show that we are willing to listen */
    if (os_fd_listen(&stream_socket->scheduler_entry.fd, 1) == -1) {
      OONF_WARN(LOG_STREAM, "tcp socket listen failed for %s: %s (%d)\n", netaddr_socket_to_string(&buf, local),
        strerror(errno), errno);
      goto add_stream_error;
    }
    stream_socket->scheduler_entry.name = stream_socket->socket_name;
    stream_socket->scheduler_entry.process = _cb_parse_request;

    snprintf(stream_socket->socket_name, sizeof(stream_socket->socket_name), "tcp-server: %s",
      netaddr_socket_to_string(&buf, local));
    oonf_socket_add(&stream_socket->scheduler_entry);
    oonf_socket_set_read(&stream_socket->scheduler_entry, true);
  }
  memcpy(&stream_socket->local_socket, local, sizeof(stream_socket->local_socket));

  if (stream_socket->config.memcookie == NULL) {
    stream_socket->config.memcookie = &_connection_cookie;
  }
  if (stream_socket->config.allowed_sessions == 0) {
    stream_socket->config.allowed_sessions = 10;
  }
  if (stream_socket->config.maximum_input_buffer == 0) {
    stream_socket->config.maximum_input_buffer = 65536;
  }

  list_init_head(&stream_socket->session);
  list_add_tail(&_stream_head, &stream_socket->_node);

  return 0;

add_stream_error:
  oonf_socket_remove(&stream_socket->scheduler_entry);
  os_fd_close(&stream_socket->scheduler_entry.fd);
  return -1;
}